

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O2

int ZXing::DataMatrix::FindMinimums(array<int,_6UL> *intCharCounts,int min,array<int,_6UL> *mins)

{
  int iVar1;
  uint in_EAX;
  int i;
  long lVar2;
  undefined8 local_38;
  
  local_38 = (ulong)in_EAX;
  std::array<int,_6UL>::fill(mins,(value_type_conflict3 *)((long)&local_38 + 4));
  lVar2 = 0;
  do {
    if (lVar2 == 6) {
      return min;
    }
    iVar1 = intCharCounts->_M_elems[lVar2];
    if (iVar1 < min) {
      local_38 = local_38 & 0xffffffff00000000;
      std::array<int,_6UL>::fill(mins,(value_type_conflict3 *)&local_38);
      min = iVar1;
LAB_0016b35d:
      mins->_M_elems[lVar2] = mins->_M_elems[lVar2] + 1;
    }
    else if (min == iVar1) goto LAB_0016b35d;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static int FindMinimums(const std::array<int, 6>& intCharCounts, int min, std::array<int, 6>& mins)
{
	mins.fill(0);
	for (int i = 0; i < 6; i++) {
		int current = intCharCounts[i];
		if (min > current) {
			min = current;
			mins.fill(0);
		}
		if (min == current) {
			mins[i]++;
		}
	}
	return min;
}